

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

RepeatedPrimitiveDefaults *
google::protobuf::internal::RepeatedPrimitiveDefaults::default_instance(void)

{
  int iVar1;
  RepeatedPrimitiveDefaults *p;
  
  if (default_instance()::instance == '\0') {
    iVar1 = __cxa_guard_acquire(&default_instance()::instance);
    if (iVar1 != 0) {
      p = (RepeatedPrimitiveDefaults *)operator_new(0x70);
      (p->default_repeated_field_bool_).soo_rep_.field_0.long_rep.elements_int = 0;
      (p->default_repeated_field_bool_).soo_rep_.field_0.short_rep.field_1 =
           (anon_union_8_2_4f9aec01_for_ShortSooRep_1)0x0;
      (p->default_repeated_field_float_).soo_rep_.field_0.long_rep.elements_int = 0;
      (p->default_repeated_field_float_).soo_rep_.field_0.short_rep.field_1 =
           (anon_union_8_2_4f9aec01_for_ShortSooRep_1)0x0;
      (p->default_repeated_field_double_).soo_rep_.field_0.long_rep.elements_int = 0;
      (p->default_repeated_field_double_).soo_rep_.field_0.short_rep.field_1 =
           (anon_union_8_2_4f9aec01_for_ShortSooRep_1)0x0;
      (p->default_repeated_field_uint64_t_).soo_rep_.field_0.long_rep.elements_int = 0;
      (p->default_repeated_field_uint64_t_).soo_rep_.field_0.short_rep.field_1 =
           (anon_union_8_2_4f9aec01_for_ShortSooRep_1)0x0;
      (p->default_repeated_field_uint32_t_).soo_rep_.field_0.long_rep.elements_int = 0;
      (p->default_repeated_field_uint32_t_).soo_rep_.field_0.short_rep.field_1 =
           (anon_union_8_2_4f9aec01_for_ShortSooRep_1)0x0;
      (p->default_repeated_field_int64_t_).soo_rep_.field_0.long_rep.elements_int = 0;
      (p->default_repeated_field_int64_t_).soo_rep_.field_0.short_rep.field_1 =
           (anon_union_8_2_4f9aec01_for_ShortSooRep_1)0x0;
      (p->default_repeated_field_int32_t_).soo_rep_.field_0.long_rep.elements_int = 0;
      (p->default_repeated_field_int32_t_).soo_rep_.field_0.short_rep.field_1 =
           (anon_union_8_2_4f9aec01_for_ShortSooRep_1)0x0;
      default_instance::instance =
           OnShutdownDelete<google::protobuf::internal::RepeatedPrimitiveDefaults>(p);
      __cxa_guard_release(&default_instance()::instance);
    }
  }
  return default_instance::instance;
}

Assistant:

const RepeatedPrimitiveDefaults* RepeatedPrimitiveDefaults::default_instance() {
  static auto instance = OnShutdownDelete(new RepeatedPrimitiveDefaults);
  return instance;
}